

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O0

bool __thiscall
PsxRelocator::relocateFile(PsxRelocator *this,PsxRelocatorFile *file,int *relocationAddress)

{
  uint uVar1;
  mapped_type_conflict1 mVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ErrorType type;
  reference pPVar8;
  element_type *peVar9;
  int64_t iVar10;
  size_t sVar11;
  reference pPVar12;
  reference pbVar13;
  reference pRVar14;
  mapped_type_conflict1 *pmVar15;
  byte *__dest;
  byte *__src;
  size_t __n;
  vector<PsxRelocation,_std::allocator<PsxRelocation>_> **ppvVar16;
  size_t extraout_RDX;
  undefined1 auVar17 [16];
  string_view text;
  string_view text_00;
  size_t arrayStart;
  RelocationAction *action;
  iterator __end2_1;
  iterator __begin2_1;
  vector<RelocationAction,_std::allocator<RelocationAction>_> *__range2_1;
  string *error_2;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  string *error_1;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  undefined1 local_1b8 [7];
  bool result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_1;
  long lStack_198;
  int pos_1;
  RelocationData relData;
  PsxRelocation *rel;
  iterator __end2;
  iterator __begin2;
  vector<PsxRelocation,_std::allocator<PsxRelocation>_> *__range2;
  vector<RelocationAction,_std::allocator<RelocationAction>_> relocationActions;
  ByteArray sectionData;
  PsxSegment *seg_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<PsxSegment,_std::allocator<PsxSegment>_> *__range1_2;
  size_t dataStart;
  int pos;
  PsxSymbol *sym;
  iterator __end1_1;
  iterator __begin1_1;
  vector<PsxSymbol,_std::allocator<PsxSymbol>_> *__range1_1;
  bool error;
  size_t size;
  reference pPStack_b0;
  int index;
  PsxSegment *seg;
  iterator __end1;
  iterator __begin1;
  vector<PsxSegment,_std::allocator<PsxSegment>_> *__range1;
  undefined1 local_88 [4];
  int start;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> symbolOffsets;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> relocationOffsets;
  int *relocationAddress_local;
  PsxRelocatorFile *file_local;
  PsxRelocator *this_local;
  
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_88)
  ;
  uVar1 = *relocationAddress;
  __end1 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::begin(&file->segments);
  seg = (PsxSegment *)std::vector<PsxSegment,_std::allocator<PsxSegment>_>::end(&file->segments);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<PsxSegment_*,_std::vector<PsxSegment,_std::allocator<PsxSegment>_>_>
                                     *)&seg), bVar4) {
    pPStack_b0 = __gnu_cxx::
                 __normal_iterator<PsxSegment_*,_std::vector<PsxSegment,_std::allocator<PsxSegment>_>_>
                 ::operator*(&__end1);
    size._4_4_ = pPStack_b0->id;
    sVar11 = ByteArray::size(&pPStack_b0->data);
    mVar2 = *relocationAddress;
    pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (key_type_conflict *)((long)&size + 4));
    *pmVar15 = mVar2;
    *relocationAddress = (int)sVar11 + *relocationAddress;
    while (*relocationAddress % 4 != 0) {
      *relocationAddress = *relocationAddress + 1;
    }
    __gnu_cxx::
    __normal_iterator<PsxSegment_*,_std::vector<PsxSegment,_std::allocator<PsxSegment>_>_>::
    operator++(&__end1);
  }
  bVar4 = false;
  __end1_1 = std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::begin(&file->symbols);
  sym = (PsxSymbol *)std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::end(&file->symbols);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<PsxSymbol_*,_std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>_>
                             *)&sym), bVar5) {
    pPVar8 = __gnu_cxx::
             __normal_iterator<PsxSymbol_*,_std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>_>::
             operator*(&__end1_1);
    switch(pPVar8->type) {
    case Internal:
    case Function:
      peVar9 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &pPVar8->label);
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &pPVar8->segment);
      Label::setValue(peVar9,(long)(*pmVar15 + pPVar8->offset));
      peVar9 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &pPVar8->label);
      Label::setDefined(peVar9,true);
      break;
    case InternalID:
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &pPVar8->segment);
      iVar6 = *pmVar15 + pPVar8->offset;
      peVar9 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &pPVar8->label);
      Label::setValue(peVar9,(long)iVar6);
      peVar9 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &pPVar8->label);
      Label::setDefined(peVar9,true);
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)local_88,&pPVar8->id);
      *pmVar15 = iVar6;
      break;
    case External:
      peVar9 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &pPVar8->label);
      bVar5 = Label::isDefined(peVar9);
      if (bVar5) {
        peVar9 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            &pPVar8->label);
        iVar10 = Label::getValue(peVar9);
        pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)local_88,&pPVar8->id);
        *pmVar15 = (mapped_type_conflict1)iVar10;
      }
      else {
        Logger::queueError<std::__cxx11::string,std::__cxx11::string>
                  (Error,"Undefined external symbol %s in file %s",&pPVar8->name,&file->name);
        bVar4 = true;
      }
      break;
    case BSS:
      peVar9 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &pPVar8->label);
      Label::setValue(peVar9,(long)*relocationAddress);
      peVar9 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &pPVar8->label);
      Label::setDefined(peVar9,true);
      mVar2 = *relocationAddress;
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)local_88,&pPVar8->id);
      *pmVar15 = mVar2;
      *relocationAddress = pPVar8->size + *relocationAddress;
      while (*relocationAddress % 4 != 0) {
        *relocationAddress = *relocationAddress + 1;
      }
    }
    __gnu_cxx::__normal_iterator<PsxSymbol_*,_std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>_>::
    operator++(&__end1_1);
  }
  if (bVar4) {
    this_local._7_1_ = false;
  }
  else {
    sVar11 = ByteArray::size(&this->outputData);
    ppvVar16 = (vector<PsxRelocation,_std::allocator<PsxRelocation>_> **)(ulong)uVar1;
    ByteArray::reserveBytes(&this->outputData,(long)(int)(*relocationAddress - uVar1),'\0');
    __end1_2 = std::vector<PsxSegment,_std::allocator<PsxSegment>_>::begin(&file->segments);
    seg_1 = (PsxSegment *)std::vector<PsxSegment,_std::allocator<PsxSegment>_>::end(&file->segments)
    ;
    bVar3 = 0;
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<PsxSegment_*,_std::vector<PsxSegment,_std::allocator<PsxSegment>_>_>
                               *)&seg_1), bVar4) {
      pPVar12 = __gnu_cxx::
                __normal_iterator<PsxSegment_*,_std::vector<PsxSegment,_std::allocator<PsxSegment>_>_>
                ::operator*(&__end1_2);
      ByteArray::ByteArray
                ((ByteArray *)
                 &relocationActions.
                  super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&pPVar12->data);
      std::vector<RelocationAction,_std::allocator<RelocationAction>_>::vector
                ((vector<RelocationAction,_std::allocator<RelocationAction>_> *)&__range2);
      __end2 = std::vector<PsxRelocation,_std::allocator<PsxRelocation>_>::begin
                         (&pPVar12->relocations);
      rel = (PsxRelocation *)
            std::vector<PsxRelocation,_std::allocator<PsxRelocation>_>::end(&pPVar12->relocations);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<PsxRelocation_*,_std::vector<PsxRelocation,_std::allocator<PsxRelocation>_>_>
                                         *)&rel), bVar4) {
        relData._32_8_ =
             __gnu_cxx::
             __normal_iterator<PsxRelocation_*,_std::vector<PsxRelocation,_std::allocator<PsxRelocation>_>_>
             ::operator*(&__end2);
        errors_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             ((reference)relData._32_8_)->segmentOffset;
        lStack_198 = (long)errors_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        relData.relocationBase._0_4_ =
             ByteArray::getDoubleWord
                       ((ByteArray *)
                        &relocationActions.
                         super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)errors_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,Little);
        if (*(int *)(relData._32_8_ + 4) == 0) {
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_88,(key_type_conflict *)(relData._32_8_ + 0xc));
          relData.opcodeOffset = (int64_t)(*pmVar15 + *(int *)(relData._32_8_ + 0x14));
          ppvVar16 = (vector<PsxRelocation,_std::allocator<PsxRelocation>_> **)relData._32_8_;
        }
        else if (*(int *)(relData._32_8_ + 4) == 1) {
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (key_type_conflict *)(relData._32_8_ + 0xc));
          relData.opcodeOffset =
               (int64_t)(*pmVar15 + *(int *)(relData._32_8_ + 0x10) +
                        *(int *)(relData._32_8_ + 0x14));
          ppvVar16 = (vector<PsxRelocation,_std::allocator<PsxRelocation>_> **)relData._32_8_;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8);
        __range4._7_1_ = 0;
        switch(*(undefined4 *)relData._32_8_) {
        case 0:
          ppvVar16 = &__range2;
          iVar6 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[4])
                            (this->reloc,2,&stack0xfffffffffffffe68,ppvVar16,local_1b8);
          __range4._7_1_ = (byte)iVar6 & 1;
          break;
        case 1:
          ppvVar16 = &__range2;
          iVar6 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[4])
                            (this->reloc,5,&stack0xfffffffffffffe68,ppvVar16,local_1b8);
          __range4._7_1_ = (byte)iVar6 & 1;
          break;
        case 2:
          ppvVar16 = &__range2;
          iVar6 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[4])
                            (this->reloc,6,&stack0xfffffffffffffe68,ppvVar16,local_1b8);
          __range4._7_1_ = (byte)iVar6 & 1;
          break;
        case 3:
          ppvVar16 = &__range2;
          iVar6 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[4])
                            (this->reloc,4,&stack0xfffffffffffffe68,ppvVar16,local_1b8);
          __range4._7_1_ = (byte)iVar6 & 1;
        }
        if (__range4._7_1_ == 0) {
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8);
          error_1 = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b8);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&error_1), bVar4) {
            pbVar13 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4);
            auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar13);
            text._M_len = auVar17._8_8_;
            errors.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar17._0_8_;
            text._M_str = (char *)ppvVar16;
            Logger::queueError((Logger *)0x1,auVar17._0_4_,text);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          bVar3 = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
        __gnu_cxx::
        __normal_iterator<PsxRelocation_*,_std::vector<PsxRelocation,_std::allocator<PsxRelocation>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3);
      uVar7 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[5])
                        (this->reloc,&__range2,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
      if ((uVar7 & 1) == 0) {
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
        error_2 = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range3);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&error_2), bVar4) {
          pbVar13 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
          type = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar13);
          text_00._M_str = (char *)ppvVar16;
          text_00._M_len = extraout_RDX;
          Logger::queueError((Logger *)0x1,type,text_00);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        bVar3 = 1;
      }
      __end2_1 = std::vector<RelocationAction,_std::allocator<RelocationAction>_>::begin
                           ((vector<RelocationAction,_std::allocator<RelocationAction>_> *)&__range2
                           );
      action = (RelocationAction *)
               std::vector<RelocationAction,_std::allocator<RelocationAction>_>::end
                         ((vector<RelocationAction,_std::allocator<RelocationAction>_> *)&__range2);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<RelocationAction_*,_std::vector<RelocationAction,_std::allocator<RelocationAction>_>_>
                                 *)&action), bVar4) {
        pRVar14 = __gnu_cxx::
                  __normal_iterator<RelocationAction_*,_std::vector<RelocationAction,_std::allocator<RelocationAction>_>_>
                  ::operator*(&__end2_1);
        ByteArray::replaceDoubleWord
                  ((ByteArray *)
                   &relocationActions.
                    super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pRVar14->offset,pRVar14->newValue,
                   Little);
        __gnu_cxx::
        __normal_iterator<RelocationAction_*,_std::vector<RelocationAction,_std::allocator<RelocationAction>_>_>
        ::operator++(&__end2_1);
      }
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &pPVar12->id);
      ppvVar16 = (vector<PsxRelocation,_std::allocator<PsxRelocation>_> **)(long)(int)uVar1;
      __dest = ByteArray::data(&this->outputData,(sVar11 + (long)*pmVar15) - (long)ppvVar16);
      __src = ByteArray::data((ByteArray *)
                              &relocationActions.
                               super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      __n = ByteArray::size((ByteArray *)
                            &relocationActions.
                             super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      memcpy(__dest,__src,__n);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3);
      std::vector<RelocationAction,_std::allocator<RelocationAction>_>::~vector
                ((vector<RelocationAction,_std::allocator<RelocationAction>_> *)&__range2);
      ByteArray::~ByteArray
                ((ByteArray *)
                 &relocationActions.
                  super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<PsxSegment_*,_std::vector<PsxSegment,_std::allocator<PsxSegment>_>_>::
      operator++(&__end1_2);
    }
    this_local._7_1_ = (bool)(bVar3 ^ 1);
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_88)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this_local._7_1_;
}

Assistant:

bool PsxRelocator::relocateFile(PsxRelocatorFile& file, int& relocationAddress)
{
	std::map<int,int> relocationOffsets;
	std::map<int,int> symbolOffsets;
	int start = relocationAddress;

	// assign addresses to segments
	for (PsxSegment& seg: file.segments)
	{
		int index = seg.id;
		size_t size = seg.data.size();
		
		relocationOffsets[index] = relocationAddress;
		relocationAddress += (int) size;

		while (relocationAddress % 4)
			relocationAddress++;
	}
	
	// parse/add/relocate symbols
	bool error = false;
	for (PsxSymbol& sym: file.symbols)
	{
		int pos;
		switch (sym.type)
		{
		case PsxSymbolType::Internal:
		case PsxSymbolType::Function:
			sym.label->setValue(relocationOffsets[sym.segment]+sym.offset);
			sym.label->setDefined(true);
			break;
		case PsxSymbolType::InternalID:
			pos = relocationOffsets[sym.segment]+sym.offset;
			sym.label->setValue(pos);
			sym.label->setDefined(true);
			symbolOffsets[sym.id] = pos;
			break;
		case PsxSymbolType::BSS:
			sym.label->setValue(relocationAddress);
			sym.label->setDefined(true);
			symbolOffsets[sym.id] = relocationAddress;
			relocationAddress += sym.size;
			
			while (relocationAddress % 4)
				relocationAddress++;
			break;
		case PsxSymbolType::External:
			if (!sym.label->isDefined())
			{
				Logger::queueError(Logger::Error, "Undefined external symbol %s in file %s",sym.name,file.name);
				error = true;
				continue;
			}
			
			symbolOffsets[sym.id] = (int) sym.label->getValue();
			break;
		}
	}

	if (error)
		return false;

	size_t dataStart = outputData.size();
	outputData.reserveBytes(relocationAddress-start);

	// load code and data
	for (PsxSegment& seg: file.segments)
	{
		// relocate
		ByteArray sectionData = seg.data;

		std::vector<RelocationAction> relocationActions;
		for (PsxRelocation& rel: seg.relocations)
		{
			RelocationData relData;
			int pos = rel.segmentOffset;
			relData.opcodeOffset = pos;
			relData.opcode = sectionData.getDoubleWord(pos);

			switch (rel.refType)
			{
			case PsxRelocationRefType::SymblId:
				relData.relocationBase = symbolOffsets[rel.referenceId]+rel.relativeOffset;
				break;
			case PsxRelocationRefType::SegmentOffset:
				relData.relocationBase = relocationOffsets[rel.referenceId] + rel.referencePos+rel.relativeOffset;
				break;
			}

			std::vector<std::string> errors;
			bool result = false;

			switch (rel.type)
			{
			case PsxRelocationType::WordLiteral:
				result = reloc->relocateOpcode(R_MIPS_32,relData, relocationActions, errors);
				break;
			case PsxRelocationType::UpperImmediate:
				result = reloc->relocateOpcode(R_MIPS_HI16,relData, relocationActions, errors);
				break;
			case PsxRelocationType::LowerImmediate:
				result = reloc->relocateOpcode(R_MIPS_LO16,relData, relocationActions, errors);
				break;
			case PsxRelocationType::FunctionCall:
				result = reloc->relocateOpcode(R_MIPS_26,relData, relocationActions, errors);
				break;
			}

			if (!result)
			{
				for (const std::string& error : errors)
				{
					Logger::queueError(Logger::Error, error);
				}
				error = true;
			}
		}

		// finish any dangling relocations
		std::vector<std::string> errors;
		if (!reloc->finish(relocationActions, errors))
		{
			for (const std::string& error : errors)
			{
				Logger::queueError(Logger::Error, error);
			}
			error = true;
		}

		// now actually write the relocated values
		for (const RelocationAction& action : relocationActions)
		{
			sectionData.replaceDoubleWord(action.offset, action.newValue);
		}

		size_t arrayStart = dataStart+relocationOffsets[seg.id]-start;
		memcpy(outputData.data(arrayStart),sectionData.data(),sectionData.size());
	}

	return !error;
}